

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkAttachmentDescriptionStencilLayout * __thiscall
Fossilize::StateRecorder::Impl::copy<VkAttachmentDescriptionStencilLayout>
          (Impl *this,VkAttachmentDescriptionStencilLayout *src,size_t count,ScratchAllocator *alloc
          )

{
  VkAttachmentDescriptionStencilLayout *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkAttachmentDescriptionStencilLayout>(alloc,count);
    if (pVVar1 != (VkAttachmentDescriptionStencilLayout *)0x0) {
      pVVar1 = (VkAttachmentDescriptionStencilLayout *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkAttachmentDescriptionStencilLayout *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}